

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O0

void stackjit::Amd64Backend::moveMemoryRegWithIntOffsetToReg
               (CodeGen *codeGen,ExtendedRegisters dest,Registers srcMemReg,int offset)

{
  ulong local_30;
  size_t i;
  value_type_conflict1 local_1f;
  byte local_1e;
  value_type_conflict1 local_1d;
  IntToBytes converter;
  int local_18;
  Registers local_12;
  ExtendedRegisters local_11;
  int offset_local;
  Registers srcMemReg_local;
  ExtendedRegisters dest_local;
  CodeGen *codeGen_local;
  
  local_18 = offset;
  local_12 = srcMemReg;
  local_11 = dest;
  _offset_local = codeGen;
  if (srcMemReg == SP) {
    converter.byteValues[0] = 'L';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,converter.byteValues);
    local_1d = 0x8b;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(_offset_local,&local_1d);
    local_1e = local_11 << 3 | 0x84;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(_offset_local,&local_1e);
    local_1f = '$';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(_offset_local,&local_1f);
  }
  else {
    converter.byteValues[3] = 'L';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,converter.byteValues + 3);
    converter.byteValues[2] = 0x8b;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_offset_local,converter.byteValues + 2);
    converter.byteValues[1] = local_12 | 0x80 | local_11 << 3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_offset_local,converter.byteValues + 1);
  }
  i._4_4_ = local_18;
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_offset_local,(value_type_conflict1 *)((long)&i + local_30 + 4));
  }
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithIntOffsetToReg(CodeGen& codeGen, ExtendedRegisters dest, Registers srcMemReg, int offset) {
		if (srcMemReg != Registers::SP) {
			codeGen.push_back(0x4c);
			codeGen.push_back(0x8b);
			codeGen.push_back(0x80 | (Byte)srcMemReg | ((Byte)dest << 3));
		} else {
			codeGen.push_back(0x4c);
			codeGen.push_back(0x8b);
			codeGen.push_back(0x84 | ((Byte)dest << 3));
			codeGen.push_back(0x24);
		}

		IntToBytes converter;
		converter.intValue = offset;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}